

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

HeapType __thiscall
wasm::anon_unknown_0::RecGroupStore::insert
          (RecGroupStore *this,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  ulong uVar1;
  int iVar2;
  RecGroup RVar3;
  uintptr_t uVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)wasm::(anonymous_namespace)::globalRecGroupStore);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar1 = (this->mutex).super___mutex_base._M_mutex.__align;
  if (*(long *)(uVar1 + 0x20) == 0) {
    if (uVar1 < 0x7d) {
      __assert_fail("!isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                    ,0x4ed,"RecGroup wasm::HeapType::getRecGroup() const");
    }
    RVar3 = insert((RecGroupStore *)(uVar1 | 1),(RecGroup)info);
    if ((RecGroupStore *)(uVar1 | 1) == (RecGroupStore *)RVar3.id) {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                                 wasm::(anonymous_namespace)::globalHeapTypeStoreMutex);
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      std::
      vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
      ::
      emplace_back<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>
                ((vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
                  *)&wasm::(anonymous_namespace)::globalHeapTypeStore,
                 (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                  *)this);
      pthread_mutex_unlock((pthread_mutex_t *)wasm::(anonymous_namespace)::globalHeapTypeStoreMutex)
      ;
    }
    if ((RVar3.id & 1) == 0) {
      uVar4 = **(uintptr_t **)RVar3.id;
    }
    else {
      uVar4 = RVar3.id & 0xfffffffffffffffe;
    }
    pthread_mutex_unlock((pthread_mutex_t *)wasm::(anonymous_namespace)::globalRecGroupStore);
    return (HeapType)uVar4;
  }
  __assert_fail("!info->recGroup && \"Unexpected nontrivial rec group\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x24e,
                "HeapType wasm::(anonymous namespace)::RecGroupStore::insert(std::unique_ptr<HeapTypeInfo> &&)"
               );
}

Assistant:

HeapType insert(std::unique_ptr<HeapTypeInfo>&& info) {
    std::lock_guard<std::mutex> lock(mutex);
    assert(!info->recGroup && "Unexpected nontrivial rec group");
    auto group = asHeapType(info).getRecGroup();
    auto canonical = insert(group);
    if (group == canonical) {
      std::lock_guard<std::recursive_mutex> storeLock(globalHeapTypeStoreMutex);
      globalHeapTypeStore.emplace_back(std::move(info));
    }
    return canonical[0];
  }